

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall
cmCTestLaunch::DumpFileToXML(cmCTestLaunch *this,cmXMLElement *e3,char *tag,string *fname)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  cmXMLElement local_260;
  cmXMLElement e4;
  char *sep;
  string line;
  ifstream fin;
  string *fname_local;
  char *tag_local;
  cmXMLElement *e3_local;
  cmCTestLaunch *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar3,_Var2);
  std::__cxx11::string::string((string *)&sep);
  e4.xmlwr = (cmXMLWriter *)0x88e6c0;
  cmXMLElement::cmXMLElement(&local_260,e3,tag);
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)(line.field_2._M_local_buf + 8),(string *)&sep,(bool *)0x0,-1
                           ), bVar1) {
    bVar1 = MatchesFilterPrefix(this,(string *)&sep);
    if (!bVar1) {
      bVar1 = Match(this,(string *)&sep,&this->RegexWarningSuppress);
      if (bVar1) {
        std::operator+(&local_290,"[CTest: warning suppressed] ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep);
        std::__cxx11::string::operator=((string *)&sep,(string *)&local_290);
        std::__cxx11::string::~string((string *)&local_290);
      }
      else {
        bVar1 = Match(this,(string *)&sep,&this->RegexWarning);
        if (bVar1) {
          std::operator+(&local_2b0,"[CTest: warning matched] ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep);
          std::__cxx11::string::operator=((string *)&sep,(string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
        }
      }
      cmXMLElement::Content<char_const*>(&local_260,(char **)&e4);
      cmXMLElement::Content<std::__cxx11::string>
                (&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sep);
      e4.xmlwr = (cmXMLWriter *)0x8ae536;
    }
  }
  cmXMLElement::~cmXMLElement(&local_260);
  std::__cxx11::string::~string((string *)&sep);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

void cmCTestLaunch::DumpFileToXML(cmXMLElement& e3, const char* tag,
                                  std::string const& fname)
{
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);

  std::string line;
  const char* sep = "";

  cmXMLElement e4(e3, tag);
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (MatchesFilterPrefix(line)) {
      continue;
    }
    if (this->Match(line, this->RegexWarningSuppress)) {
      line = "[CTest: warning suppressed] " + line;
    } else if (this->Match(line, this->RegexWarning)) {
      line = "[CTest: warning matched] " + line;
    }
    e4.Content(sep);
    e4.Content(line);
    sep = "\n";
  }
}